

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O3

bool __thiscall
CompareTxMemPoolEntryByScore::operator()
          (CompareTxMemPoolEntryByScore *this,CTxMemPoolEntry *a,CTxMemPoolEntry *b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int64_t iVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = a->nFee;
  iVar6 = GetVirtualTransactionSize((long)b->nTxWeight,b->sigOpCost,nBytesPerSigOp);
  lVar3 = b->nFee;
  dVar7 = (double)(int)iVar6 * (double)lVar2;
  iVar6 = GetVirtualTransactionSize((long)a->nTxWeight,a->sigOpCost,nBytesPerSigOp);
  dVar8 = (double)(int)iVar6 * (double)lVar3;
  if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
    bVar4 = dVar8 < dVar7;
  }
  else {
    iVar5 = memcmp(&((b->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash,
                   &((a->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash,0x20);
    bVar4 = SUB41((uint)iVar5 >> 0x1f,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const CTxMemPoolEntry& a, const CTxMemPoolEntry& b) const
    {
        double f1 = (double)a.GetFee() * b.GetTxSize();
        double f2 = (double)b.GetFee() * a.GetTxSize();
        if (f1 == f2) {
            return b.GetTx().GetHash() < a.GetTx().GetHash();
        }
        return f1 > f2;
    }